

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::FixedLinearAllocator::FixedLinearAllocator
          (FixedLinearAllocator *this,IMemoryAllocator *Allocator)

{
  IMemoryAllocator *Allocator_local;
  FixedLinearAllocator *this_local;
  
  this->m_pDataStart = (uint8_t *)0x0;
  this->m_pCurrPtr = (uint8_t *)0x0;
  this->m_ReservedSize = 0;
  this->m_CurrAlignment = 0;
  this->m_pAllocator = Allocator;
  this->m_DbgCurrAllocation = 0;
  std::
  vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ::vector(&this->m_DbgAllocations);
  this->m_DbgUsingExternalMemory = false;
  return;
}

Assistant:

explicit FixedLinearAllocator(IMemoryAllocator& Allocator) noexcept :
        m_pAllocator{&Allocator}
    {}